

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_archipelago.hpp
# Opt level: O1

uint32_t __thiscall
PatchHandleArchipelago::inject_func_boot_init(PatchHandleArchipelago *this,ROM *rom)

{
  uint32_t uVar1;
  Code func;
  string local_c8;
  Param local_a8;
  undefined8 local_a0;
  Code local_98;
  
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._vptr_Param = (_func_int **)&PTR_getXn_00261cd8;
  local_a0 = 0x200ff0020;
  local_c8._M_dataplus._M_p = (pointer)&PTR_getXn_00261c98;
  local_c8._M_string_length = 0xff;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::move(&local_98,(Param *)&local_c8,&local_a8,BYTE);
  local_a8._vptr_Param = (_func_int **)&PTR_getXn_00261cd8;
  local_a0 = 0x200ff0022;
  local_c8._M_dataplus._M_p = (pointer)&PTR_getXn_00261c98;
  local_c8._M_string_length = CONCAT44(2,this->_seed);
  md::Code::move(&local_98,(Param *)&local_c8,&local_a8,LONG);
  local_a8._vptr_Param = (_func_int **)&PTR_getXn_00261cd8;
  local_a0 = 0x200ff107e;
  local_c8._M_dataplus._M_p = (pointer)&PTR_getXn_00261c98;
  local_c8._M_string_length = 0x100000000;
  md::Code::move(&local_98,(Param *)&local_c8,&local_a8,WORD);
  local_c8._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_c8._M_string_length = 0x200000230;
  md::Code::jsr(&local_98,(Param *)&local_c8);
  md::Code::rts(&local_98);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  uVar1 = md::ROM::inject_code(rom,&local_98,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_98._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_98._pending_branches._M_t);
  if (local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

uint32_t inject_func_boot_init(md::ROM& rom) const
    {
        md::Code func;
        {
            func.moveb(0xFF, addr_(ADDR_ARCHIPELAGO_RECEIVED_ITEM));
            func.movel(_seed, addr_(ADDR_ARCHIPELAGO_SEED));
            func.movew(0x0000, addr_(ADDR_CURRENT_RECEIVED_ITEM_INDEX));
        }
        func.jsr(0x230); // call j_DisableDisplayAndInts whose call was replaced by this function
        func.rts();
        return rom.inject_code(func);
    }